

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::MILSpec::TensorValue::ByteSizeLong(TensorValue *this)

{
  ulong uVar1;
  size_t sVar2;
  
  switch(this->_oneof_case_[0]) {
  case 1:
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::MILSpec::TensorValue_RepeatedFloats>
                      ((this->value_).floats_);
    break;
  case 2:
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::MILSpec::TensorValue_RepeatedInts>
                      ((this->value_).ints_);
    break;
  case 3:
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::MILSpec::TensorValue_RepeatedBools>
                      ((this->value_).bools_);
    break;
  case 4:
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::MILSpec::TensorValue_RepeatedStrings>
                      ((this->value_).strings_);
    break;
  case 5:
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::MILSpec::TensorValue_RepeatedLongInts>
                      ((this->value_).longints_);
    break;
  case 6:
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::MILSpec::TensorValue_RepeatedDoubles>
                      ((this->value_).doubles_);
    break;
  case 7:
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::MILSpec::TensorValue_RepeatedBytes>
                      ((this->value_).bytes_);
    break;
  default:
    sVar2 = 0;
    goto LAB_001b14d8;
  }
  sVar2 = sVar2 + 1;
LAB_001b14d8:
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    sVar2 = sVar2 + *(long *)((uVar1 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar2;
  return sVar2;
}

Assistant:

size_t TensorValue::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.MILSpec.TensorValue)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  switch (value_case()) {
    // .CoreML.Specification.MILSpec.TensorValue.RepeatedFloats floats = 1;
    case kFloats: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *value_.floats_);
      break;
    }
    // .CoreML.Specification.MILSpec.TensorValue.RepeatedInts ints = 2;
    case kInts: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *value_.ints_);
      break;
    }
    // .CoreML.Specification.MILSpec.TensorValue.RepeatedBools bools = 3;
    case kBools: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *value_.bools_);
      break;
    }
    // .CoreML.Specification.MILSpec.TensorValue.RepeatedStrings strings = 4;
    case kStrings: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *value_.strings_);
      break;
    }
    // .CoreML.Specification.MILSpec.TensorValue.RepeatedLongInts longInts = 5;
    case kLongInts: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *value_.longints_);
      break;
    }
    // .CoreML.Specification.MILSpec.TensorValue.RepeatedDoubles doubles = 6;
    case kDoubles: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *value_.doubles_);
      break;
    }
    // .CoreML.Specification.MILSpec.TensorValue.RepeatedBytes bytes = 7;
    case kBytes: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *value_.bytes_);
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}